

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall spirv_cross::Compiler::update_active_builtins(Compiler *this)

{
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRFunction *func;
  SPIRVariable *pSVar4;
  long lVar5;
  LoopLock loop_lock;
  ActiveBuiltinHandler handler;
  LoopLock LStack_48;
  ActiveBuiltinHandler local_40;
  
  Bitset::reset(&this->active_input_builtins);
  Bitset::reset(&this->active_output_builtins);
  this->clip_distance_count = 0;
  this->cull_distance_count = 0;
  local_40.super_OpcodeHandler._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_0039f318;
  local_40.compiler = this;
  func = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_40.super_OpcodeHandler);
  ParsedIR::create_loop_hard_lock(&this->ir);
  pTVar1 = (this->ir).ids_for_type[2].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
           .ptr;
  sVar2 = (this->ir).ids_for_type[2].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
    id = *(uint *)((long)&pTVar1->id + lVar5);
    if ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[id].type == TypeVariable) {
      pSVar4 = ParsedIR::get<spirv_cross::SPIRVariable>(&this->ir,id);
      if (pSVar4->storage == StorageClassOutput) {
        bVar3 = interface_variable_exists_in_entry_point(this,(pSVar4->super_IVariant).self.id);
        if (bVar3 && (pSVar4->initializer).id != 0) {
          ActiveBuiltinHandler::add_if_builtin_or_block(&local_40,(pSVar4->super_IVariant).self.id);
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&LStack_48);
  return;
}

Assistant:

void Compiler::update_active_builtins()
{
	active_input_builtins.reset();
	active_output_builtins.reset();
	cull_distance_count = 0;
	clip_distance_count = 0;
	ActiveBuiltinHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage != StorageClassOutput)
			return;
		if (!interface_variable_exists_in_entry_point(var.self))
			return;

		// Also, make sure we preserve output variables which are only initialized, but never accessed by any code.
		if (var.initializer != ID(0))
			handler.add_if_builtin_or_block(var.self);
	});
}